

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *v,void *v_min,void *v_max,
               char *format,float power,ImGuiSliderFlags flags)

{
  char *pcVar1;
  undefined8 *puVar2;
  ImVec4 *pIVar3;
  double dVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  int iVar13;
  int iVar14;
  ImU32 IVar15;
  int iVar16;
  ulong uVar17;
  ImRect *pIVar18;
  ImVec2 *pIVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ImGuiWindow *pIVar28;
  ImGuiContext *g;
  uint uVar29;
  uint uVar30;
  char *pcVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  ImDrawList *this;
  bool bVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  double dVar45;
  ImVec2 IVar46;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 uVar50;
  undefined4 uVar53;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  char v_str [64];
  ImVec2 local_a8;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  undefined8 local_80;
  ImVec4 local_78 [4];
  undefined8 extraout_XMM0_Qb_00;
  
  pIVar12 = GImGui;
  switch(data_type) {
  case 0:
    iVar14 = *v_min;
    if ((iVar14 < -0x40000000) || (iVar35 = *v_max, 0x3fffffff < iVar35)) {
      __assert_fail("*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x234f,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar28 = GImGui->CurrentWindow;
    pIVar28->WriteAccessed = true;
    iVar13 = 9;
    if (pIVar12->ActiveId != id) {
      iVar13 = (pIVar12->HoveredId == id) + 7;
    }
    puVar2 = (undefined8 *)((long)&(pIVar12->Style).Colors[0].x + (ulong)(uint)(iVar13 << 4));
    local_78[0]._0_8_ = *puVar2;
    uVar50 = puVar2[1];
    local_78[0].w = (float)((ulong)uVar50 >> 0x20);
    local_78[0].z = (float)uVar50;
    local_78[0].w = (pIVar12->Style).Alpha * local_78[0].w;
    IVar15 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar15,true,(pIVar12->Style).FrameRounding);
    pIVar11 = GImGui;
    uVar34 = flags & 1;
    pIVar19 = (ImVec2 *)&(bb->Max).y;
    if (uVar34 == 0) {
      pIVar19 = &bb->Max;
    }
    fVar43 = pIVar19->x;
    fVar57 = (&(bb->Min).x)[uVar34];
    fVar42 = (fVar43 - fVar57) + -4.0;
    iVar13 = iVar35 - iVar14;
    uVar39 = iVar14 - iVar35;
    uVar40 = -uVar39;
    if (0 < (int)uVar39) {
      uVar40 = uVar39;
    }
    fVar62 = (pIVar12->Style).GrabMinSize;
    fVar58 = fVar42 / (float)(int)(uVar40 + 1);
    uVar39 = -(uint)(fVar62 <= fVar58);
    fVar62 = (float)(~uVar39 & (uint)fVar62 | (uint)fVar58 & uVar39);
    if (fVar42 <= fVar62) {
      fVar62 = fVar42;
    }
    fVar57 = fVar57 + 2.0 + fVar62 * 0.5;
    if (pIVar12->ActiveId == id) {
      if (pIVar12->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar46 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar11 = GImGui;
        fVar42 = IVar46.x;
        if (uVar34 != 0) {
          fVar42 = -IVar46.y;
        }
        if ((pIVar12->NavActivatePressedId != id) || (pIVar12->ActiveIdIsJustActivated != false)) {
          fVar58 = 0.0;
          if ((fVar42 != 0.0) || (NAN(fVar42))) {
            if (iVar14 != iVar35) {
              iVar22 = iVar35;
              if (iVar14 < iVar35) {
                iVar22 = iVar14;
              }
              iVar16 = iVar35;
              if (iVar35 < iVar14) {
                iVar16 = iVar14;
              }
              iVar7 = *v;
              if (iVar7 < iVar16) {
                iVar16 = iVar7;
              }
              if (iVar7 < iVar22) {
                iVar16 = iVar22;
              }
              fVar58 = (float)(iVar16 - iVar14) / (float)iVar13;
            }
            if ((uVar40 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              fVar42 = *(float *)(&DAT_001c57a8 + (ulong)(fVar42 < 0.0) * 4) / (float)(int)uVar40;
            }
            else {
              fVar42 = fVar42 / 100.0;
            }
            uVar40 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar42 = (float)(~uVar40 & (uint)fVar42 | (uint)(fVar42 * 10.0) & uVar40);
            if (((fVar58 < 1.0) || (fVar42 <= 0.0)) && ((0.0 < fVar58 || (0.0 <= fVar42)))) {
              fVar58 = fVar58 + fVar42;
              fVar61 = 1.0;
              if (fVar58 <= 1.0) {
                fVar61 = fVar58;
              }
              fVar61 = (float)(~-(uint)(fVar58 < 0.0) & (uint)fVar61);
              goto LAB_001795b2;
            }
          }
          goto LAB_0017947f;
        }
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
      }
      else {
        if (pIVar12->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_0017947f;
        if ((pIVar12->IO).MouseDown[0] != false) {
          fVar61 = 0.0;
          if (0.0 < fVar42 - fVar62) {
            fVar42 = (*(float *)((pIVar12->IO).MouseDown + (ulong)uVar34 * 4 + -8) - fVar57) /
                     (fVar42 - fVar62);
            fVar61 = 1.0;
            if (fVar42 <= 1.0) {
              fVar61 = fVar42;
            }
            fVar61 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar61);
          }
          if (uVar34 != 0) {
            fVar61 = 1.0 - fVar61;
          }
LAB_001795b2:
          iVar16 = (int)((float)iVar13 * fVar61);
          iVar22 = (int)((float)iVar13 * fVar61 + 0.5);
          if (iVar22 < iVar16) {
            iVar22 = iVar16;
          }
          local_a8.x = (float)(iVar22 + iVar14);
LAB_001795dc:
          cVar5 = *format;
          if (cVar5 != '\0') {
            if ((cVar5 != '%') || (format[1] == '%')) goto LAB_001795f4;
            ImFormatString((char *)local_78,0x40,format);
            pcVar31 = (char *)((long)&local_80 + 7);
            do {
              pcVar1 = pcVar31 + 1;
              pcVar31 = pcVar31 + 1;
            } while (*pcVar1 == ' ');
            ImAtoi<int>(pcVar31,(int *)&local_a8);
          }
          if (*v == local_a8.x) {
            bVar37 = false;
          }
          else {
            *(float *)v = local_a8.x;
            bVar37 = true;
          }
          goto LAB_00179486;
        }
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
      }
      if (bVar37) {
        pIVar11->ActiveIdTimer = 0.0;
      }
      bVar37 = false;
      pIVar11->ActiveId = 0;
      pIVar11->ActiveIdAllowNavDirFlags = 0;
      pIVar11->ActiveIdAllowOverlap = false;
      pIVar11->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    else {
LAB_0017947f:
      bVar37 = false;
    }
LAB_00179486:
    fVar42 = 0.0;
    if (iVar14 != iVar35) {
      iVar22 = iVar35;
      if (iVar14 < iVar35) {
        iVar22 = iVar14;
      }
      if (iVar35 < iVar14) {
        iVar35 = iVar14;
      }
      iVar16 = *v;
      if (iVar16 < iVar35) {
        iVar35 = iVar16;
      }
      if (iVar16 < iVar22) {
        iVar35 = iVar22;
      }
      fVar42 = (float)(iVar35 - iVar14) / (float)iVar13;
    }
    if (uVar34 != 0) {
      fVar42 = 1.0 - fVar42;
    }
    fVar58 = -fVar62;
    fVar57 = (((fVar43 + -2.0) - fVar62 * 0.5) - fVar57) * fVar42 + fVar57;
    if (uVar34 == 0) {
      local_a8.x = fVar58 * 0.5 + fVar57;
      local_a8.y = (bb->Min).y;
      local_a0.x = fVar62 * 0.5 + fVar57;
      local_a0.y = (bb->Max).y;
      goto LAB_0017951d;
    }
    local_a8.x = (bb->Min).x;
    local_a0.x = (bb->Max).x;
LAB_00179539:
    local_a8.x = local_a8.x + 2.0;
    local_a0.x = local_a0.x + -2.0;
    local_a8.y = fVar58 * 0.5 + fVar57;
    local_a0.y = fVar62 * 0.5 + fVar57;
    break;
  case 1:
    uVar34 = *v_min;
    if ((int)uVar34 < 0) {
      __assert_fail("*(const ImU32*)v_min <= IM_U32_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2352,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    uVar40 = *v_max;
    pIVar28 = GImGui->CurrentWindow;
    pIVar28->WriteAccessed = true;
    iVar14 = 9;
    if (pIVar12->ActiveId != id) {
      iVar14 = (pIVar12->HoveredId == id) + 7;
    }
    uVar29 = -(uVar34 - uVar40);
    uVar39 = uVar34 - uVar40;
    if (uVar34 < uVar40) {
      uVar39 = uVar29;
    }
    puVar2 = (undefined8 *)((long)&(pIVar12->Style).Colors[0].x + (ulong)(uint)(iVar14 << 4));
    local_78[0]._0_8_ = *puVar2;
    uVar50 = puVar2[1];
    local_78[0].w = (float)((ulong)uVar50 >> 0x20);
    local_78[0].z = (float)uVar50;
    local_78[0].w = (pIVar12->Style).Alpha * local_78[0].w;
    IVar15 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar15,true,(pIVar12->Style).FrameRounding);
    pIVar11 = GImGui;
    uVar30 = flags & 1;
    pIVar19 = (ImVec2 *)&(bb->Max).y;
    if (uVar30 == 0) {
      pIVar19 = &bb->Max;
    }
    fVar43 = pIVar19->x;
    fVar42 = (fVar43 - (&(bb->Min).x)[uVar30]) + -4.0;
    fVar57 = (pIVar12->Style).GrabMinSize;
    if (-1 < (int)uVar39) {
      fVar62 = fVar42 / (float)(int)(uVar39 + 1);
      uVar38 = -(uint)(fVar57 <= fVar62);
      fVar57 = (float)(~uVar38 & (uint)fVar57 | (uint)fVar62 & uVar38);
    }
    if (fVar42 <= fVar57) {
      fVar57 = fVar42;
    }
    pIVar18 = (ImRect *)&(bb->Min).y;
    if (uVar30 == 0) {
      pIVar18 = bb;
    }
    fVar62 = (pIVar18->Min).x + 2.0 + fVar57 * 0.5;
    if (pIVar12->ActiveId == id) {
      if (pIVar12->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar46 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar11 = GImGui;
        fVar42 = IVar46.x;
        if (uVar30 != 0) {
          fVar42 = -IVar46.y;
        }
        if ((pIVar12->NavActivatePressedId == id) && (pIVar12->ActiveIdIsJustActivated == false)) {
          bVar37 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar37;
          if (bVar37) {
            pIVar11->ActiveIdTimer = 0.0;
          }
          pIVar11->ActiveId = 0;
          pIVar11->ActiveIdAllowNavDirFlags = 0;
          pIVar11->ActiveIdAllowOverlap = false;
          pIVar11->ActiveIdWindow = (ImGuiWindow *)0x0;
        }
        else {
          fVar58 = 0.0;
          if ((fVar42 != 0.0) || (NAN(fVar42))) {
            if (uVar40 != uVar34) {
              uVar38 = uVar40;
              if (uVar40 >= uVar34 && uVar40 != uVar34) {
                uVar38 = uVar34;
              }
              uVar6 = *v;
              uVar26 = uVar40;
              if (uVar40 < uVar34) {
                uVar26 = uVar34;
              }
              if (uVar6 < uVar26) {
                uVar26 = uVar6;
              }
              if (uVar6 < uVar38) {
                uVar26 = uVar38;
              }
              fVar58 = (float)(uVar26 - uVar34) / (float)uVar29;
            }
            if ((uVar39 + 100 < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              fVar42 = *(float *)(&DAT_001c57a8 + (ulong)(fVar42 < 0.0) * 4) / (float)(int)uVar39;
            }
            else {
              fVar42 = fVar42 / 100.0;
            }
            uVar39 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar42 = (float)(~uVar39 & (uint)fVar42 | (uint)(fVar42 * 10.0) & uVar39);
            if (((fVar58 < 1.0) || (fVar42 <= 0.0)) && ((0.0 < fVar58 || (0.0 <= fVar42)))) {
              fVar58 = fVar58 + fVar42;
              fVar61 = 1.0;
              if (fVar58 <= 1.0) {
                fVar61 = fVar58;
              }
              fVar61 = (float)(~-(uint)(fVar58 < 0.0) & (uint)fVar61);
              goto LAB_00179112;
            }
            goto LAB_00178fbe;
          }
        }
        goto LAB_00178308;
      }
      if (pIVar12->ActiveIdSource == ImGuiInputSource_Mouse) {
        if ((pIVar12->IO).MouseDown[0] != false) {
          fVar61 = 0.0;
          if (0.0 < fVar42 - fVar57) {
            fVar42 = (*(float *)((pIVar12->IO).MouseDown + (ulong)uVar30 * 4 + -8) - fVar62) /
                     (fVar42 - fVar57);
            fVar61 = 1.0;
            if (fVar42 <= 1.0) {
              fVar61 = fVar42;
            }
            fVar61 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar61);
          }
          if (uVar30 != 0) {
            fVar61 = 1.0 - fVar61;
          }
LAB_00179112:
          uVar38 = (uint)(long)((float)uVar29 * fVar61);
          uVar39 = (uint)(long)((float)uVar29 * fVar61 + 0.5);
          if (uVar39 < uVar38) {
            uVar39 = uVar38;
          }
          local_a8.x = (float)(uVar39 + uVar34);
LAB_00179146:
          cVar5 = *format;
          if (cVar5 != '\0') {
            if ((cVar5 != '%') || (format[1] == '%')) goto LAB_0017915e;
            ImFormatString((char *)local_78,0x40,format);
            pcVar31 = (char *)((long)&local_80 + 7);
            do {
              pcVar1 = pcVar31 + 1;
              pcVar31 = pcVar31 + 1;
            } while (*pcVar1 == ' ');
            ImAtoi<int>(pcVar31,(int *)&local_a8);
          }
          if (*v == local_a8.x) {
            bVar37 = false;
          }
          else {
            *(float *)v = local_a8.x;
            bVar37 = true;
          }
          goto LAB_00178fc3;
        }
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
        if (bVar37) {
          pIVar11->ActiveIdTimer = 0.0;
        }
        bVar37 = false;
        pIVar11->ActiveId = 0;
        pIVar11->ActiveIdAllowNavDirFlags = 0;
        pIVar11->ActiveIdAllowOverlap = false;
        pIVar11->ActiveIdWindow = (ImGuiWindow *)0x0;
      }
      else {
LAB_00178fbe:
        bVar37 = false;
      }
    }
    else {
LAB_00178308:
      bVar37 = false;
    }
LAB_00178fc3:
    fVar42 = 0.0;
    if (uVar40 != uVar34) {
      uVar39 = uVar40;
      if (uVar40 >= uVar34 && uVar40 != uVar34) {
        uVar39 = uVar34;
      }
      uVar38 = *v;
      if (uVar40 < uVar34) {
        uVar40 = uVar34;
      }
      if (uVar38 < uVar40) {
        uVar40 = uVar38;
      }
      if (uVar38 < uVar39) {
        uVar40 = uVar39;
      }
      fVar42 = (float)(uVar40 - uVar34) / (float)uVar29;
    }
    if (uVar30 != 0) {
      fVar42 = 1.0 - fVar42;
    }
    fVar62 = (((fVar43 + -2.0) - fVar57 * 0.5) - fVar62) * fVar42 + fVar62;
    if (uVar30 != 0) {
      local_a8.x = (bb->Min).x + 2.0;
      local_a0.x = (bb->Max).x + -2.0;
      local_a8.y = -fVar57 * 0.5 + fVar62;
      local_a0.y = fVar57 * 0.5 + fVar62;
    }
    else {
      local_a8.x = -fVar57 * 0.5 + fVar62;
      local_a0.x = fVar57 * 0.5 + fVar62;
      local_a8.y = (bb->Min).y + 2.0;
      local_a0.y = (bb->Max).y + -2.0;
    }
    this = pIVar28->DrawList;
    pIVar3 = (GImGui->Style).Colors + (ulong)(pIVar12->ActiveId == id) + 0x13;
    local_78[0].x = pIVar3->x;
    local_78[0].y = pIVar3->y;
    uVar50._0_4_ = pIVar3->z;
    uVar50._4_4_ = pIVar3->w;
    goto LAB_00179f31;
  case 2:
    lVar33 = *v_min;
    if ((lVar33 < -0x4000000000000000) || (lVar36 = *v_max, 0x3fffffffffffffff < lVar36)) {
      __assert_fail("*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2355,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar28 = GImGui->CurrentWindow;
    pIVar28->WriteAccessed = true;
    iVar14 = 9;
    if (pIVar12->ActiveId != id) {
      iVar14 = (pIVar12->HoveredId == id) + 7;
    }
    puVar2 = (undefined8 *)((long)&(pIVar12->Style).Colors[0].x + (ulong)(uint)(iVar14 << 4));
    local_78[0]._0_8_ = *puVar2;
    uVar50 = puVar2[1];
    local_78[0].w = (float)((ulong)uVar50 >> 0x20);
    local_78[0].z = (float)uVar50;
    local_78[0].w = (pIVar12->Style).Alpha * local_78[0].w;
    IVar15 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar15,true,(pIVar12->Style).FrameRounding);
    pIVar11 = GImGui;
    uVar34 = flags & 1;
    pIVar19 = (ImVec2 *)&(bb->Max).y;
    if (uVar34 == 0) {
      pIVar19 = &bb->Max;
    }
    fVar43 = pIVar19->x;
    fVar57 = (&(bb->Min).x)[uVar34];
    fVar42 = (fVar43 - fVar57) + -4.0;
    lVar32 = lVar36 - lVar33;
    uVar17 = lVar33 - lVar36;
    uVar41 = -uVar17;
    if (0 < (long)uVar17) {
      uVar41 = uVar17;
    }
    fVar62 = (pIVar12->Style).GrabMinSize;
    fVar58 = fVar42 / (float)(long)(uVar41 + 1);
    uVar40 = -(uint)(fVar62 <= fVar58);
    fVar62 = (float)(~uVar40 & (uint)fVar62 | (uint)fVar58 & uVar40);
    if (fVar42 <= fVar62) {
      fVar62 = fVar42;
    }
    fVar57 = fVar57 + 2.0 + fVar62 * 0.5;
    if (pIVar12->ActiveId == id) {
      if (pIVar12->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar46 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar11 = GImGui;
        fVar42 = IVar46.x;
        if (uVar34 != 0) {
          fVar42 = -IVar46.y;
        }
        if ((pIVar12->NavActivatePressedId != id) || (pIVar12->ActiveIdIsJustActivated != false)) {
          fVar58 = 0.0;
          if ((fVar42 != 0.0) || (NAN(fVar42))) {
            if (lVar33 != lVar36) {
              lVar25 = lVar36;
              if (lVar33 < lVar36) {
                lVar25 = lVar33;
              }
              lVar21 = lVar36;
              if (lVar36 < lVar33) {
                lVar21 = lVar33;
              }
              lVar9 = *v;
              if (lVar9 < lVar21) {
                lVar21 = lVar9;
              }
              if (lVar9 < lVar25) {
                lVar21 = lVar25;
              }
              fVar58 = (float)((double)(lVar21 - lVar33) / (double)lVar32);
            }
            if ((uVar41 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              fVar42 = *(float *)(&DAT_001c57a8 + (ulong)(fVar42 < 0.0) * 4) / (float)(long)uVar41;
            }
            else {
              fVar42 = fVar42 / 100.0;
            }
            uVar40 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar42 = (float)(~uVar40 & (uint)fVar42 | (uint)(fVar42 * 10.0) & uVar40);
            if (((fVar58 < 1.0) || (fVar42 <= 0.0)) && ((0.0 < fVar58 || (0.0 <= fVar42)))) {
              fVar58 = fVar58 + fVar42;
              fVar61 = 1.0;
              if (fVar58 <= 1.0) {
                fVar61 = fVar58;
              }
              fVar61 = (float)(~-(uint)(fVar58 < 0.0) & (uint)fVar61);
              goto LAB_0017932f;
            }
          }
          goto LAB_00179251;
        }
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
      }
      else {
        if (pIVar12->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_00179251;
        if ((pIVar12->IO).MouseDown[0] != false) {
          fVar61 = 0.0;
          if (0.0 < fVar42 - fVar62) {
            fVar42 = (*(float *)((pIVar12->IO).MouseDown + (ulong)uVar34 * 4 + -8) - fVar57) /
                     (fVar42 - fVar62);
            fVar61 = 1.0;
            if (fVar42 <= 1.0) {
              fVar61 = fVar42;
            }
            fVar61 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar61);
          }
          if (uVar34 != 0) {
            fVar61 = 1.0 - fVar61;
          }
LAB_0017932f:
          lVar21 = (long)((float)lVar32 * fVar61);
          lVar25 = (long)((float)lVar32 * fVar61 + 0.5);
          if (lVar25 < lVar21) {
            lVar25 = lVar21;
          }
          local_a8 = (ImVec2)(lVar25 + lVar33);
LAB_00179366:
          cVar5 = *format;
          if (cVar5 != '\0') {
            if ((cVar5 != '%') || (format[1] == '%')) goto LAB_0017937e;
            ImFormatString((char *)local_78,0x40,format);
            pcVar31 = (char *)((long)&local_80 + 7);
            do {
              pcVar1 = pcVar31 + 1;
              pcVar31 = pcVar31 + 1;
            } while (*pcVar1 == ' ');
            ImAtoi<long_long>(pcVar31,(longlong *)&local_a8);
          }
          if (*v == local_a8) {
            bVar37 = false;
          }
          else {
            *(ImVec2 *)v = local_a8;
            bVar37 = true;
          }
          goto LAB_00179258;
        }
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
      }
      if (bVar37) {
        pIVar11->ActiveIdTimer = 0.0;
      }
      bVar37 = false;
      pIVar11->ActiveId = 0;
      pIVar11->ActiveIdAllowNavDirFlags = 0;
      pIVar11->ActiveIdAllowOverlap = false;
      pIVar11->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    else {
LAB_00179251:
      bVar37 = false;
    }
LAB_00179258:
    fVar42 = 0.0;
    if (lVar33 != lVar36) {
      lVar25 = lVar36;
      if (lVar33 < lVar36) {
        lVar25 = lVar33;
      }
      if (lVar36 < lVar33) {
        lVar36 = lVar33;
      }
      lVar21 = *v;
      if (lVar21 < lVar36) {
        lVar36 = lVar21;
      }
      if (lVar21 < lVar25) {
        lVar36 = lVar25;
      }
      fVar42 = (float)((double)(lVar36 - lVar33) / (double)lVar32);
    }
    if (uVar34 != 0) {
      fVar42 = 1.0 - fVar42;
    }
    fVar58 = -fVar62;
    fVar57 = (((fVar43 + -2.0) - fVar62 * 0.5) - fVar57) * fVar42 + fVar57;
    if (uVar34 != 0) {
      local_a8.x = (bb->Min).x;
      local_a0.x = (bb->Max).x;
      goto LAB_00179539;
    }
    local_a8.x = fVar58 * 0.5 + fVar57;
    local_a8.y = (bb->Min).y;
    local_a0.x = fVar62 * 0.5 + fVar57;
    local_a0.y = (bb->Max).y;
LAB_0017951d:
    local_a8.y = local_a8.y + 2.0;
    local_a0.y = local_a0.y + -2.0;
    break;
  case 3:
    uVar41 = *v_min;
    if ((long)uVar41 < 0) {
      __assert_fail("*(const ImU64*)v_min <= IM_U64_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2358,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    uVar17 = *v_max;
    pIVar28 = GImGui->CurrentWindow;
    pIVar28->WriteAccessed = true;
    iVar14 = 9;
    if (pIVar12->ActiveId != id) {
      iVar14 = (pIVar12->HoveredId == id) + 7;
    }
    uVar23 = -(uVar41 - uVar17);
    uVar20 = uVar41 - uVar17;
    if (uVar41 < uVar17) {
      uVar20 = uVar23;
    }
    puVar2 = (undefined8 *)((long)&(pIVar12->Style).Colors[0].x + (ulong)(uint)(iVar14 << 4));
    local_78[0]._0_8_ = *puVar2;
    uVar50 = puVar2[1];
    local_78[0].w = (float)((ulong)uVar50 >> 0x20);
    local_78[0].z = (float)uVar50;
    local_78[0].w = (pIVar12->Style).Alpha * local_78[0].w;
    IVar15 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar15,true,(pIVar12->Style).FrameRounding);
    pIVar11 = GImGui;
    uVar34 = flags & 1;
    pIVar19 = (ImVec2 *)&(bb->Max).y;
    if (uVar34 == 0) {
      pIVar19 = &bb->Max;
    }
    fVar43 = pIVar19->x;
    fVar42 = (fVar43 - (&(bb->Min).x)[uVar34]) + -4.0;
    fVar57 = (pIVar12->Style).GrabMinSize;
    if (-1 < (long)uVar20) {
      fVar62 = fVar42 / (float)(long)(uVar20 + 1);
      uVar40 = -(uint)(fVar57 <= fVar62);
      fVar57 = (float)(~uVar40 & (uint)fVar57 | (uint)fVar62 & uVar40);
    }
    if (fVar42 <= fVar57) {
      fVar57 = fVar42;
    }
    pIVar18 = (ImRect *)&(bb->Min).y;
    if (uVar34 == 0) {
      pIVar18 = bb;
    }
    fVar62 = (pIVar18->Min).x + 2.0 + fVar57 * 0.5;
    uVar53 = (undefined4)(uVar23 >> 0x20);
    if (pIVar12->ActiveId == id) {
      if (pIVar12->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar46 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar11 = GImGui;
        fVar42 = IVar46.x;
        if (uVar34 != 0) {
          fVar42 = -IVar46.y;
        }
        if ((pIVar12->NavActivatePressedId == id) && (pIVar12->ActiveIdIsJustActivated == false)) {
          bVar37 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar37;
          if (bVar37) {
            pIVar11->ActiveIdTimer = 0.0;
          }
          pIVar11->ActiveId = 0;
          pIVar11->ActiveIdAllowNavDirFlags = 0;
          pIVar11->ActiveIdAllowOverlap = false;
          pIVar11->ActiveIdWindow = (ImGuiWindow *)0x0;
        }
        else {
          fVar58 = 0.0;
          if ((fVar42 != 0.0) || (NAN(fVar42))) {
            if (uVar17 != uVar41) {
              uVar27 = uVar17;
              if (uVar17 >= uVar41 && uVar17 != uVar41) {
                uVar27 = uVar41;
              }
              uVar24 = uVar17;
              if (uVar17 < uVar41) {
                uVar24 = uVar41;
              }
              uVar8 = *v;
              if (uVar8 < uVar24) {
                uVar24 = uVar8;
              }
              if (uVar8 < uVar27) {
                uVar24 = uVar27;
              }
              lVar33 = uVar24 - uVar41;
              auVar51._8_4_ = (int)((ulong)lVar33 >> 0x20);
              auVar51._0_8_ = lVar33;
              auVar51._12_4_ = 0x45300000;
              auVar52._8_4_ = uVar53;
              auVar52._0_8_ = uVar23;
              auVar52._12_4_ = 0x45300000;
              fVar58 = (float)(((auVar51._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0)) /
                              ((auVar52._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0)));
            }
            if ((uVar20 + 100 < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              fVar42 = *(float *)(&DAT_001c57a8 + (ulong)(fVar42 < 0.0) * 4) / (float)(long)uVar20;
            }
            else {
              fVar42 = fVar42 / 100.0;
            }
            uVar40 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar42 = (float)(~uVar40 & (uint)fVar42 | (uint)(fVar42 * 10.0) & uVar40);
            if (((fVar58 < 1.0) || (fVar42 <= 0.0)) && ((0.0 < fVar58 || (0.0 <= fVar42)))) {
              fVar58 = fVar58 + fVar42;
              fVar61 = 1.0;
              if (fVar58 <= 1.0) {
                fVar61 = fVar58;
              }
              fVar61 = (float)(~-(uint)(fVar58 < 0.0) & (uint)fVar61);
              goto LAB_00178e1a;
            }
            goto LAB_00178cbc;
          }
        }
        goto LAB_001781d3;
      }
      if (pIVar12->ActiveIdSource == ImGuiInputSource_Mouse) {
        if ((pIVar12->IO).MouseDown[0] != false) {
          fVar61 = 0.0;
          if (0.0 < fVar42 - fVar57) {
            fVar42 = (*(float *)((pIVar12->IO).MouseDown + (ulong)uVar34 * 4 + -8) - fVar62) /
                     (fVar42 - fVar57);
            fVar61 = 1.0;
            if (fVar42 <= 1.0) {
              fVar61 = fVar42;
            }
            fVar61 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar61);
          }
          if (uVar34 != 0) {
            fVar61 = 1.0 - fVar61;
          }
LAB_00178e1a:
          fVar61 = fVar61 * (float)uVar23;
          uVar27 = (long)(fVar61 - 9.223372e+18) & (long)fVar61 >> 0x3f | (long)fVar61;
          uVar20 = (ulong)(fVar61 + 0.5);
          uVar20 = (long)((fVar61 + 0.5) - 9.223372e+18) & (long)uVar20 >> 0x3f | uVar20;
          if (uVar20 < uVar27) {
            uVar20 = uVar27;
          }
          local_a8 = (ImVec2)(uVar20 + uVar41);
LAB_00178ea7:
          cVar5 = *format;
          if (cVar5 != '\0') {
            if ((cVar5 != '%') || (format[1] == '%')) goto LAB_00178ebf;
            ImFormatString((char *)local_78,0x40,format);
            pcVar31 = (char *)((long)&local_80 + 7);
            do {
              pcVar1 = pcVar31 + 1;
              pcVar31 = pcVar31 + 1;
            } while (*pcVar1 == ' ');
            ImAtoi<long_long>(pcVar31,(longlong *)&local_a8);
          }
          if (*v == local_a8) {
            bVar37 = false;
          }
          else {
            *(ImVec2 *)v = local_a8;
            bVar37 = true;
          }
          goto LAB_00178cc3;
        }
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
        if (bVar37) {
          pIVar11->ActiveIdTimer = 0.0;
        }
        bVar37 = false;
        pIVar11->ActiveId = 0;
        pIVar11->ActiveIdAllowNavDirFlags = 0;
        pIVar11->ActiveIdAllowOverlap = false;
        pIVar11->ActiveIdWindow = (ImGuiWindow *)0x0;
      }
      else {
LAB_00178cbc:
        bVar37 = false;
      }
    }
    else {
LAB_001781d3:
      bVar37 = false;
    }
LAB_00178cc3:
    fVar42 = 0.0;
    if (uVar17 != uVar41) {
      uVar20 = uVar17;
      if (uVar41 < uVar17) {
        uVar20 = uVar41;
      }
      if (uVar17 < uVar41) {
        uVar17 = uVar41;
      }
      uVar27 = *v;
      if (uVar27 < uVar17) {
        uVar17 = uVar27;
      }
      if (uVar27 < uVar20) {
        uVar17 = uVar20;
      }
      lVar33 = uVar17 - uVar41;
      auVar48._8_4_ = (int)((ulong)lVar33 >> 0x20);
      auVar48._0_8_ = lVar33;
      auVar48._12_4_ = 0x45300000;
      auVar49._8_4_ = uVar53;
      auVar49._0_8_ = uVar23;
      auVar49._12_4_ = 0x45300000;
      fVar42 = (float)(((auVar48._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0)) /
                      ((auVar49._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0)));
    }
    if (uVar34 != 0) {
      fVar42 = 1.0 - fVar42;
    }
    fVar62 = (((fVar43 + -2.0) - fVar57 * 0.5) - fVar62) * fVar42 + fVar62;
    if (uVar34 != 0) {
      local_a8.x = (bb->Min).x + 2.0;
      local_a0.x = (bb->Max).x + -2.0;
      local_a8.y = -fVar57 * 0.5 + fVar62;
      local_a0.y = fVar57 * 0.5 + fVar62;
    }
    else {
      local_a8.x = -fVar57 * 0.5 + fVar62;
      local_a0.x = fVar57 * 0.5 + fVar62;
      local_a8.y = (bb->Min).y + 2.0;
      local_a0.y = (bb->Max).y + -2.0;
    }
    goto LAB_0017957c;
  case 4:
    fVar43 = *v_min;
    if ((fVar43 < -1.7014117e+38) || (fVar62 = *v_max, 1.7014117e+38 < fVar62)) {
      __assert_fail("*(const float*)v_min >= -3.40282347e+38F/2.0f && *(const float*)v_max <= 3.40282347e+38F/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x235b,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar28 = GImGui->CurrentWindow;
    pIVar28->WriteAccessed = true;
    iVar14 = 9;
    if (pIVar12->ActiveId != id) {
      iVar14 = (pIVar12->HoveredId == id) + 7;
    }
    puVar2 = (undefined8 *)((long)&(pIVar12->Style).Colors[0].x + (ulong)(uint)(iVar14 << 4));
    local_78[0]._0_8_ = *puVar2;
    uVar50 = puVar2[1];
    local_78[0].w = (float)((ulong)uVar50 >> 0x20);
    local_78[0].z = (float)uVar50;
    local_78[0].w = (pIVar12->Style).Alpha * local_78[0].w;
    IVar15 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar15,true,(pIVar12->Style).FrameRounding);
    uVar34 = flags & 1;
    pIVar19 = (ImVec2 *)&(bb->Max).y;
    if (uVar34 == 0) {
      pIVar19 = &bb->Max;
    }
    fVar61 = pIVar19->x;
    fVar57 = (&(bb->Min).x)[uVar34];
    fVar58 = (fVar61 - fVar57) + -4.0;
    fVar42 = (pIVar12->Style).GrabMinSize;
    if (fVar58 <= fVar42) {
      fVar42 = fVar58;
    }
    if (((power == 1.0) && (!NAN(power))) || (0.0 <= fVar43 * fVar62)) {
      fVar60 = (float)(-(uint)(fVar43 < 0.0) & 0x3f800000);
    }
    else {
      uVar40 = -(uint)(-fVar43 <= fVar43);
      local_98._0_4_ = fVar58;
      local_80 = (double)CONCAT44(local_80._4_4_,1.0 / power);
      fVar60 = powf((float)(uVar40 & (uint)fVar43 | ~uVar40 & (uint)-fVar43),1.0 / power);
      uVar40 = -(uint)(-fVar62 <= fVar62);
      fVar58 = powf((float)(uVar40 & (uint)fVar62 | ~uVar40 & (uint)-fVar62),(float)local_80);
      fVar60 = fVar60 / (fVar58 + fVar60);
      fVar58 = (float)local_98._0_4_;
    }
    pIVar11 = GImGui;
    fVar57 = fVar57 + 2.0 + fVar42 * 0.5;
    if (pIVar12->ActiveId == id) {
      if (pIVar12->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar46 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar11 = GImGui;
        fVar58 = IVar46.y;
        auVar56._8_4_ = (float)(int)extraout_XMM0_Qb;
        auVar56._0_4_ = IVar46.x;
        auVar56._4_4_ = IVar46.y;
        auVar56._12_4_ = (float)(int)((ulong)extraout_XMM0_Qb >> 0x20);
        if (uVar34 != 0) {
          auVar56._0_8_ = CONCAT44(fVar58,fVar58) ^ 0x8000000080000000;
          auVar56._8_4_ = -fVar58;
          auVar56._12_4_ = -fVar58;
        }
        if ((pIVar12->NavActivatePressedId != id) || (pIVar12->ActiveIdIsJustActivated != false)) {
          fVar58 = 0.0;
          if ((auVar56._0_4_ != 0.0) || (NAN(auVar56._0_4_))) {
            if ((fVar43 != fVar62) || (NAN(fVar43) || NAN(fVar62))) {
              fVar58 = *v;
              fVar44 = fVar62;
              fVar59 = fVar43;
              if (fVar62 <= fVar43) {
                fVar44 = fVar43;
                fVar59 = fVar62;
              }
              if (fVar58 <= fVar44) {
                fVar44 = fVar58;
              }
              fVar58 = (float)(~-(uint)(fVar58 < fVar59) & (uint)fVar44 |
                              (uint)fVar59 & -(uint)(fVar58 < fVar59));
              if ((power != 1.0) || (NAN(power))) {
                local_98 = auVar56;
                if (0.0 <= fVar58) {
                  fVar59 = (float)(~-(uint)(fVar43 <= 0.0) & (uint)fVar43);
                  fVar58 = powf((fVar58 - fVar59) / (fVar62 - fVar59),1.0 / power);
                  fVar58 = (1.0 - fVar60) * fVar58 + fVar60;
                  auVar56 = local_98;
                }
                else {
                  fVar59 = 0.0;
                  if (fVar62 <= 0.0) {
                    fVar59 = fVar62;
                  }
                  fVar58 = powf(1.0 - (fVar58 - fVar43) / (fVar59 - fVar43),1.0 / power);
                  fVar58 = (1.0 - fVar58) * fVar60;
                  auVar56 = local_98;
                }
              }
              else {
                fVar58 = (fVar58 - fVar43) / (fVar62 - fVar43);
              }
            }
            fVar59 = auVar56._0_4_ / 100.0;
            uVar40 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xe]);
            fVar59 = (float)(~uVar40 & (uint)fVar59 | (uint)(fVar59 / 10.0) & uVar40);
            uVar40 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar59 = (float)(uVar40 & (uint)(fVar59 * 10.0) | ~uVar40 & (uint)fVar59);
            if (((fVar58 < 1.0) || (fVar59 <= 0.0)) && ((0.0 < fVar58 || (0.0 <= fVar59)))) {
              fVar58 = fVar58 + fVar59;
              fVar59 = 1.0;
              if (fVar58 <= 1.0) {
                fVar59 = fVar58;
              }
              fVar59 = (float)(~-(uint)(fVar58 < 0.0) & (uint)fVar59);
              goto LAB_00179805;
            }
          }
          goto LAB_00177ead;
        }
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
      }
      else {
        if (pIVar12->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_00177ead;
        if ((pIVar12->IO).MouseDown[0] != false) {
          fVar59 = 0.0;
          if (0.0 < fVar58 - fVar42) {
            fVar58 = (*(float *)((pIVar12->IO).MouseDown + (ulong)uVar34 * 4 + -8) - fVar57) /
                     (fVar58 - fVar42);
            fVar59 = 1.0;
            if (fVar58 <= 1.0) {
              fVar59 = fVar58;
            }
            fVar59 = (float)(~-(uint)(fVar58 < 0.0) & (uint)fVar59);
          }
          if (uVar34 != 0) {
            fVar59 = 1.0 - fVar59;
          }
LAB_00179805:
          if ((power != 1.0) || (NAN(power))) {
            if (fVar60 <= fVar59) {
              uVar40 = -(uint)(1e-06 < ABS(fVar60 + -1.0));
              fVar44 = powf((float)(~uVar40 & (uint)fVar59 |
                                   (uint)((fVar59 - fVar60) / (1.0 - fVar60)) & uVar40),power);
              fVar59 = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
              fVar58 = fVar62;
            }
            else {
              fVar44 = powf(1.0 - fVar59 / fVar60,power);
              fVar59 = fVar62;
              fVar58 = fVar43;
              if (0.0 <= fVar62) {
                fVar59 = 0.0;
              }
            }
            fVar59 = (fVar58 - fVar59) * fVar44 + fVar59;
          }
          else {
            fVar59 = (fVar62 - fVar43) * fVar59 + fVar43;
          }
LAB_00179937:
          cVar5 = *format;
          if (cVar5 != '\0') {
            if ((cVar5 != '%') || (format[1] == '%')) goto LAB_0017992a;
            ImFormatString((char *)local_78,0x40,format,(double)fVar59);
            pcVar31 = (char *)((long)&local_80 + 7);
            do {
              pcVar1 = pcVar31 + 1;
              pcVar31 = pcVar31 + 1;
            } while (*pcVar1 == ' ');
            dVar55 = atof(pcVar31);
            fVar59 = (float)dVar55;
          }
          if ((*v != fVar59) || (NAN(*v) || NAN(fVar59))) {
            *(float *)v = fVar59;
            bVar37 = true;
          }
          else {
            bVar37 = false;
          }
          goto LAB_00177eb2;
        }
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
      }
      if (bVar37) {
        pIVar11->ActiveIdTimer = 0.0;
      }
      bVar37 = false;
      pIVar11->ActiveId = 0;
      pIVar11->ActiveIdAllowNavDirFlags = 0;
      pIVar11->ActiveIdAllowOverlap = false;
      pIVar11->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    else {
LAB_00177ead:
      bVar37 = false;
    }
LAB_00177eb2:
    fVar59 = 0.0;
    if ((fVar43 != fVar62) || (NAN(fVar43) || NAN(fVar62))) {
      fVar58 = *v;
      fVar59 = fVar62;
      fVar44 = fVar43;
      if (fVar62 <= fVar43) {
        fVar59 = fVar43;
        fVar44 = fVar62;
      }
      if (fVar58 <= fVar59) {
        fVar59 = fVar58;
      }
      fVar58 = (float)(~-(uint)(fVar58 < fVar44) & (uint)fVar59 |
                      (uint)fVar44 & -(uint)(fVar58 < fVar44));
      if ((power != 1.0) || (NAN(power))) {
        if (0.0 <= fVar58) {
          fVar43 = (float)(~-(uint)(fVar43 <= 0.0) & (uint)fVar43);
          fVar43 = powf((fVar58 - fVar43) / (fVar62 - fVar43),1.0 / power);
          fVar59 = (1.0 - fVar60) * fVar43 + fVar60;
        }
        else {
          fVar59 = 0.0;
          if (fVar62 <= 0.0) {
            fVar59 = fVar62;
          }
          fVar43 = powf(1.0 - (fVar58 - fVar43) / (fVar59 - fVar43),1.0 / power);
          fVar59 = fVar60 * (1.0 - fVar43);
        }
      }
      else {
        fVar59 = (fVar58 - fVar43) / (fVar62 - fVar43);
      }
    }
    if (uVar34 != 0) {
      fVar59 = 1.0 - fVar59;
    }
    fVar58 = -fVar42;
    fVar57 = (((fVar61 + -2.0) - fVar42 * 0.5) - fVar57) * fVar59 + fVar57;
    if (uVar34 == 0) goto LAB_001788b7;
LAB_00179eaf:
    local_a8.x = (bb->Min).x + 2.0;
    local_a0.x = (bb->Max).x + -2.0;
    local_a8.y = fVar58 * 0.5 + fVar57;
    local_a0.y = fVar42 * 0.5 + fVar57;
    goto LAB_00179ee5;
  case 5:
    dVar55 = *v_min;
    if ((dVar55 < -8.988465674311579e+307) || (dVar4 = *v_max, 8.988465674311579e+307 < dVar4)) {
      __assert_fail("*(const double*)v_min >= -1.7976931348623157e+308/2.0f && *(const double*)v_max <= 1.7976931348623157e+308/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x235e,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar28 = GImGui->CurrentWindow;
    pIVar28->WriteAccessed = true;
    iVar14 = 9;
    if (pIVar12->ActiveId != id) {
      iVar14 = (pIVar12->HoveredId == id) + 7;
    }
    puVar2 = (undefined8 *)((long)&(pIVar12->Style).Colors[0].x + (ulong)(uint)(iVar14 << 4));
    local_78[0]._0_8_ = *puVar2;
    uVar50 = puVar2[1];
    local_78[0].w = (float)((ulong)uVar50 >> 0x20);
    local_78[0].z = (float)uVar50;
    local_78[0].w = (pIVar12->Style).Alpha * local_78[0].w;
    IVar15 = ColorConvertFloat4ToU32(local_78);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar15,true,(pIVar12->Style).FrameRounding);
    uVar34 = flags & 1;
    pIVar19 = (ImVec2 *)&(bb->Max).y;
    if (uVar34 == 0) {
      pIVar19 = &bb->Max;
    }
    fVar43 = pIVar19->x;
    fVar57 = (&(bb->Min).x)[uVar34];
    fVar62 = (fVar43 - fVar57) + -4.0;
    fVar42 = (pIVar12->Style).GrabMinSize;
    if (fVar62 <= fVar42) {
      fVar42 = fVar62;
    }
    if (((power == 1.0) && (!NAN(power))) || (0.0 <= dVar55 * dVar4)) {
      if (dVar55 < 0.0) {
        fVar58 = 1.0;
      }
      else {
        fVar58 = 0.0;
      }
    }
    else {
      uVar41 = -(ulong)(-dVar55 <= dVar55);
      local_80 = 1.0 / (double)power;
      local_98._0_8_ = pow((double)(uVar41 & (ulong)dVar55 | ~uVar41 & (ulong)-dVar55),local_80);
      uVar41 = -(ulong)(-dVar4 <= dVar4);
      dVar45 = pow((double)(uVar41 & (ulong)dVar4 | ~uVar41 & (ulong)-dVar4),local_80);
      fVar58 = (float)((double)local_98._0_8_ / (dVar45 + (double)local_98._0_8_));
    }
    pIVar11 = GImGui;
    fVar57 = fVar57 + 2.0 + fVar42 * 0.5;
    if (pIVar12->ActiveId == id) {
      if (pIVar12->ActiveIdSource == ImGuiInputSource_Nav) {
        auVar47._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        pIVar11 = GImGui;
        auVar47._8_8_ = extraout_XMM0_Qb_00;
        if (uVar34 != 0) {
          fVar62 = auVar47._4_4_;
          auVar47._0_8_ = (ImVec2)(CONCAT44(fVar62,fVar62) ^ 0x8000000080000000);
          auVar47._8_4_ = -fVar62;
          auVar47._12_4_ = -fVar62;
        }
        fVar62 = auVar47._0_4_;
        if ((pIVar12->NavActivatePressedId != id) || (pIVar12->ActiveIdIsJustActivated != false)) {
          fVar61 = 0.0;
          if ((fVar62 != 0.0) || (NAN(fVar62))) {
            if ((dVar55 != dVar4) || (NAN(dVar55) || NAN(dVar4))) {
              dVar45 = *v;
              dVar54 = dVar4;
              dVar10 = dVar55;
              if (dVar4 <= dVar55) {
                dVar54 = dVar55;
                dVar10 = dVar4;
              }
              if (dVar45 <= dVar54) {
                dVar54 = dVar45;
              }
              dVar45 = (double)(~-(ulong)(dVar45 < dVar10) & (ulong)dVar54 |
                               (ulong)dVar10 & -(ulong)(dVar45 < dVar10));
              if ((power != 1.0) || (NAN(power))) {
                local_98 = auVar47;
                if (0.0 <= dVar45) {
                  dVar54 = (double)(~-(ulong)(dVar55 <= 0.0) & (ulong)dVar55);
                  fVar62 = powf((float)((dVar45 - dVar54) / (dVar4 - dVar54)),1.0 / power);
                  fVar61 = (1.0 - fVar58) * fVar62 + fVar58;
                }
                else {
                  dVar54 = 0.0;
                  if (dVar4 <= 0.0) {
                    dVar54 = dVar4;
                  }
                  fVar62 = powf(1.0 - (float)((dVar45 - dVar55) / (dVar54 - dVar55)),1.0 / power);
                  fVar61 = (1.0 - fVar62) * fVar58;
                }
                fVar62 = local_98._0_4_;
              }
              else {
                fVar61 = (float)((dVar45 - dVar55) / (dVar4 - dVar55));
              }
            }
            uVar40 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xe]);
            fVar62 = (float)(~uVar40 & (uint)(fVar62 / 100.0) |
                            (uint)((fVar62 / 100.0) / 10.0) & uVar40);
            uVar40 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar62 = (float)(uVar40 & (uint)(fVar62 * 10.0) | ~uVar40 & (uint)fVar62);
            if ((1.0 <= fVar61) && (0.0 < fVar62)) {
              bVar37 = false;
              goto LAB_00179d2e;
            }
            if ((0.0 < fVar61) || (0.0 <= fVar62)) {
              fVar61 = fVar61 + fVar62;
              fVar60 = 1.0;
              if (fVar61 <= 1.0) {
                fVar60 = fVar61;
              }
              fVar60 = (float)(~-(uint)(fVar61 < 0.0) & (uint)fVar60);
              goto LAB_00179b2a;
            }
          }
          goto LAB_00179b01;
        }
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
      }
      else {
        if (pIVar12->ActiveIdSource != ImGuiInputSource_Mouse) {
LAB_00179b01:
          bVar37 = false;
          goto LAB_00179d2e;
        }
        if ((pIVar12->IO).MouseDown[0] != false) {
          fVar60 = 0.0;
          if (0.0 < fVar62 - fVar42) {
            fVar62 = (*(float *)((pIVar12->IO).MouseDown + (ulong)uVar34 * 4 + -8) - fVar57) /
                     (fVar62 - fVar42);
            fVar60 = 1.0;
            if (fVar62 <= 1.0) {
              fVar60 = fVar62;
            }
            fVar60 = (float)(~-(uint)(fVar62 < 0.0) & (uint)fVar60);
          }
          if (uVar34 != 0) {
            fVar60 = 1.0 - fVar60;
          }
LAB_00179b2a:
          if ((power != 1.0) || (NAN(power))) {
            if (fVar58 <= fVar60) {
              uVar40 = -(uint)(1e-06 < ABS(fVar58 + -1.0));
              fVar62 = powf((float)(~uVar40 & (uint)fVar60 |
                                   (uint)((fVar60 - fVar58) / (1.0 - fVar58)) & uVar40),power);
              dVar45 = (double)(-(ulong)(0.0 <= dVar55) & (ulong)dVar55);
              dVar45 = (double)fVar62 * (dVar4 - dVar45) + dVar45;
            }
            else {
              fVar62 = powf(1.0 - fVar60 / fVar58,power);
              dVar45 = dVar4;
              if (0.0 <= dVar4) {
                dVar45 = 0.0;
              }
              dVar45 = (double)fVar62 * (dVar55 - dVar45) + dVar45;
            }
          }
          else {
            dVar45 = (double)fVar60 * (dVar4 - dVar55) + dVar55;
          }
LAB_00179c89:
          cVar5 = *format;
          if (cVar5 != '\0') {
            if ((cVar5 != '%') || (format[1] == '%')) goto LAB_00179c7c;
            ImFormatString((char *)local_78,0x40,format);
            pcVar31 = (char *)((long)&local_80 + 7);
            do {
              pcVar1 = pcVar31 + 1;
              pcVar31 = pcVar31 + 1;
            } while (*pcVar1 == ' ');
            dVar45 = atof(pcVar31);
          }
          if ((*v != dVar45) || (NAN(*v) || NAN(dVar45))) {
            *(double *)v = dVar45;
            bVar37 = true;
          }
          else {
            bVar37 = false;
          }
          goto LAB_00179d2e;
        }
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
      }
      if (bVar37) {
        pIVar11->ActiveIdTimer = 0.0;
      }
      bVar37 = false;
      pIVar11->ActiveId = 0;
      pIVar11->ActiveIdAllowNavDirFlags = 0;
      pIVar11->ActiveIdAllowOverlap = false;
      pIVar11->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    else {
      bVar37 = false;
    }
LAB_00179d2e:
    fVar62 = 0.0;
    if ((dVar55 != dVar4) || (NAN(dVar55) || NAN(dVar4))) {
      dVar45 = *v;
      dVar54 = dVar4;
      dVar10 = dVar55;
      if (dVar4 <= dVar55) {
        dVar54 = dVar55;
        dVar10 = dVar4;
      }
      if (dVar45 <= dVar54) {
        dVar54 = dVar45;
      }
      dVar45 = (double)(~-(ulong)(dVar45 < dVar10) & (ulong)dVar54 |
                       (ulong)dVar10 & -(ulong)(dVar45 < dVar10));
      if ((power != 1.0) || (NAN(power))) {
        if (0.0 <= dVar45) {
          dVar55 = (double)(~-(ulong)(dVar55 <= 0.0) & (ulong)dVar55);
          fVar62 = powf((float)((dVar45 - dVar55) / (dVar4 - dVar55)),1.0 / power);
          fVar62 = (1.0 - fVar58) * fVar62 + fVar58;
        }
        else {
          dVar54 = 0.0;
          if (dVar4 <= 0.0) {
            dVar54 = dVar4;
          }
          fVar62 = powf(1.0 - (float)((dVar45 - dVar55) / (dVar54 - dVar55)),1.0 / power);
          fVar62 = fVar58 * (1.0 - fVar62);
        }
      }
      else {
        fVar62 = (float)((dVar45 - dVar55) / (dVar4 - dVar55));
      }
    }
    if (uVar34 != 0) {
      fVar62 = 1.0 - fVar62;
    }
    fVar58 = -fVar42;
    fVar57 = (((fVar43 + -2.0) - fVar42 * 0.5) - fVar57) * fVar62 + fVar57;
    if (uVar34 != 0) goto LAB_00179eaf;
LAB_001788b7:
    local_a8.x = fVar58 * 0.5 + fVar57;
    local_a0.x = fVar42 * 0.5 + fVar57;
    local_a8.y = (bb->Min).y + 2.0;
    local_a0.y = (bb->Max).y + -2.0;
LAB_00179ee5:
    this = pIVar28->DrawList;
    goto LAB_00179f10;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2362,
                  "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                 );
  }
LAB_0017957c:
  this = pIVar28->DrawList;
LAB_00179f10:
  pIVar3 = (GImGui->Style).Colors + (ulong)(pIVar12->ActiveId == id) + 0x13;
  local_78[0].x = pIVar3->x;
  local_78[0].y = pIVar3->y;
  uVar50._0_4_ = pIVar3->z;
  uVar50._4_4_ = pIVar3->w;
LAB_00179f31:
  local_78[0].w = (float)((ulong)uVar50 >> 0x20);
  local_78[0].z = (float)uVar50;
  local_78[0].w = (GImGui->Style).Alpha * local_78[0].w;
  IVar15 = ColorConvertFloat4ToU32(local_78);
  ImDrawList::AddRectFilled(this,&local_a8,&local_a0,IVar15,(pIVar12->Style).GrabRounding,0xf);
  return bVar37;
LAB_00179c7c:
  format = format + (ulong)(cVar5 == '%') + 1;
  goto LAB_00179c89;
LAB_0017992a:
  format = format + (ulong)(cVar5 == '%') + 1;
  goto LAB_00179937;
LAB_00178ebf:
  format = format + (ulong)(cVar5 == '%') + 1;
  goto LAB_00178ea7;
LAB_0017937e:
  format = format + (ulong)(cVar5 == '%') + 1;
  goto LAB_00179366;
LAB_0017915e:
  format = format + (ulong)(cVar5 == '%') + 1;
  goto LAB_00179146;
LAB_001795f4:
  format = format + (ulong)(cVar5 == '%') + 1;
  goto LAB_001795dc;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* v, const void* v_min, const void* v_max, const char* format, float power, ImGuiSliderFlags flags)
{
    switch (data_type)
    {
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)v,  *(const ImS32*)v_min,  *(const ImS32*)v_max,  format, power, flags);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)v_min <= IM_U32_MAX/2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)v,  *(const ImU32*)v_min,  *(const ImU32*)v_max,  format, power, flags);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)v,  *(const ImS64*)v_min,  *(const ImS64*)v_max,  format, power, flags);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)v_min <= IM_U64_MAX/2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)v,  *(const ImU64*)v_min,  *(const ImU64*)v_max,  format, power, flags);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)v_min >= -FLT_MAX/2.0f && *(const float*)v_max <= FLT_MAX/2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)v,  *(const float*)v_min,  *(const float*)v_max,  format, power, flags);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)v_min >= -DBL_MAX/2.0f && *(const double*)v_max <= DBL_MAX/2.0f);
        return SliderBehaviorT<double,double,double>(bb, id, data_type, (double*)v, *(const double*)v_min, *(const double*)v_max, format, power, flags);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}